

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

VectorXd __thiscall mnf::Point::pseudoLog(Point *this,Point *y)

{
  Manifold *this_00;
  long in_RDX;
  Index extraout_RDX;
  VectorXd VVar1;
  ConstRefVec local_a8;
  ConstRefVec local_80;
  RefVec local_48;
  Index local_30;
  undefined1 local_21;
  long local_20;
  Point *y_local;
  Point *this_local;
  VectorXd *out;
  
  local_21 = 0;
  local_20 = in_RDX;
  y_local = y;
  this_local = this;
  local_30 = Manifold::tangentDim((y->super_SubPoint).super_ConstSubPoint.manifold_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_30);
  this_00 = (y->super_SubPoint).super_ConstSubPoint.manifold_;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_48,
             (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_80,
             &(y->super_SubPoint).super_ConstSubPoint.value_.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            );
  SubPoint::value(&local_a8,(SubPoint *)(local_20 + 0x18));
  Manifold::pseudoLog(this_00,&local_48,&local_80,&local_a8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_a8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_80);
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd Point::pseudoLog(const Point& y) const
{
  Eigen::VectorXd out(manifold_.tangentDim());
  manifold_.pseudoLog(out, this->value_, y.value());
  return out;
}